

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawTiltedSpanPalCommand,int&,int&,int&,TVector3<float>const&,TVector3<float>const&,TVector3<float>const&,bool&,int&,float&,int&,int&>
               (int *args,int *args_1,int *args_2,TVector3<float> *args_3,TVector3<float> *args_4,
               TVector3<float> *args_5,bool *args_6,int *args_7,float *args_8,int *args_9,
               int *args_10)

{
  DrawTiltedSpanPalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  DrawTiltedSpanPalCommand *local_f8;
  DrawTiltedSpanPalCommand *local_f0;
  DrawTiltedSpanPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_ca;
  _lambda_void___1_ local_c9;
  undefined1 local_c8 [8];
  DrawTiltedSpanPalCommand command;
  DrawerCommandQueue *queue;
  TVector3<float> *args_local_5;
  TVector3<float> *args_local_4;
  TVector3<float> *args_local_3;
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  
  command.basecolormapdata = (uint8_t *)Instance();
  if ((((DrawerCommandQueue *)command.basecolormapdata)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
              ((DrawTiltedSpanPalCommand *)local_c8,*args,*args_1,*args_2,args_3,args_4,args_5,
               (bool)(*args_6 & 1),*args_7,*args_8,*args_9,*args_10);
    tryBlock = QueueCommand(int&,int&,int&,TVector3_const&,TVector3_const&,TVector3_const&,bool&,int&,float&,int&,int&)
               ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_c9);
    catchBlock = QueueCommand(int&,int&,int&,TVector3_const&,TVector3_const&,TVector3_const&,bool&,int&,float&,int&,int&)
                 ::{lambda(void*,char_const*,bool)#1}::operator_cast_to_function_pointer(&local_ca);
    VectoredTryCatch((DrawTiltedSpanPalCommand *)local_c8,tryBlock,catchBlock);
    swrenderer::DrawTiltedSpanPalCommand::~DrawTiltedSpanPalCommand
              ((DrawTiltedSpanPalCommand *)local_c8);
  }
  else {
    command_1 = (DrawTiltedSpanPalCommand *)AllocMemory(0x78);
    if (command_1 == (DrawTiltedSpanPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.basecolormapdata);
      command_1 = (DrawTiltedSpanPalCommand *)AllocMemory(0x78);
      if (command_1 == (DrawTiltedSpanPalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
              (command_1,*args,*args_1,*args_2,args_3,args_4,args_5,(bool)(*args_6 & 1),*args_7,
               *args_8,*args_9,*args_10);
    local_f0 = pDVar1;
    local_f8 = pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (command.basecolormapdata + 0x1000008),(value_type *)&local_f8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}